

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp3_qpack.c
# Opt level: O2

int nghttp3_qpack_encoder_block_stream(nghttp3_qpack_encoder *encoder,nghttp3_qpack_stream *stream)

{
  int iVar1;
  nghttp3_pq_entry *pnVar2;
  nghttp3_blocked_streams_key bsk;
  size_t local_20;
  int64_t local_18;
  
  pnVar2 = nghttp3_pq_top(&stream->max_cnts);
  local_20 = pnVar2[2].index;
  local_18 = stream->stream_id;
  iVar1 = nghttp3_ksl_insert(&encoder->blocked_streams,(nghttp3_ksl_it *)0x0,&local_20,stream);
  return iVar1;
}

Assistant:

int nghttp3_qpack_encoder_block_stream(nghttp3_qpack_encoder *encoder,
                                       nghttp3_qpack_stream *stream) {
  nghttp3_blocked_streams_key bsk = {
    .max_cnt = nghttp3_struct_of(nghttp3_pq_top(&stream->max_cnts),
                                 nghttp3_qpack_header_block_ref, max_cnts_pe)
                 ->max_cnt,
    .id = (uint64_t)stream->stream_id,
  };

  return nghttp3_ksl_insert(&encoder->blocked_streams, NULL, &bsk, stream);
}